

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O2

Flags * __thiscall pstack::Flags::parse(Flags *this,int argc,char **argv)

{
  mapped_type *pmVar1;
  runtime_error *this_00;
  string local_60 [36];
  undefined4 local_3c;
  int local_38;
  int optidx;
  int c;
  
  while( true ) {
    local_3c = 0;
    local_38 = getopt_long(argc,argv,*(undefined8 *)(this + 0x48),*(undefined8 *)this,&local_3c);
    if (local_38 == -1) {
      return this;
    }
    if (local_38 == 0x3f) break;
    pmVar1 = std::
             map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
             ::at((map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                   *)(this + 0x18),&local_38);
    std::function<void_(const_char_*)>::operator()(&pmVar1->callback,_optarg);
  }
  dump(this,(ostream *)&std::clog);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"unknown command line option ",(allocator<char> *)((long)&optidx + 3));
  std::runtime_error::runtime_error(this_00,local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Flags &
Flags::parse(int argc, char **argv) const
{
    for (;;) {
       int optidx = 0;
       int c = getopt_long(argc, argv, shortOptions.c_str(), longOptions.data(), &optidx);
       if (c == -1)
          break;

        if (c == '?') {
           dump(std::clog);
           throw std::runtime_error(std::string("unknown command line option "));
        }
        data.at(c).callback(optarg);
    }
    return *this;
}